

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setFederateOperator
          (CommonCore *this,LocalFederateId federateID,
          shared_ptr<helics::FederateOperator> *callbacks)

{
  atomic<unsigned_short> *paVar1;
  uint16_t exp;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  FederateState *pFVar5;
  InvalidIdentifier *this_00;
  ushort uVar6;
  bool bVar7;
  string_view message;
  ActionMessage fedOpUpdate;
  ActionMessage local_e0;
  
  if ((setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)::
       nullFederate == '\0') &&
     (iVar4 = __cxa_guard_acquire(&setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)
                                   ::nullFederate), iVar4 != 0)) {
    setFederateOperator::nullFederate.
    super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    (setFederateOperator::nullFederate.
     super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (setFederateOperator::nullFederate.
     super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (setFederateOperator::nullFederate.
     super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00536848;
    setFederateOperator::nullFederate.
    super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (setFederateOperator::nullFederate.
          super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 1);
    setFederateOperator::nullFederate.
    super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR__FederateOperator_00536898;
    __cxa_atexit(std::__shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&setFederateOperator::nullFederate,&__dso_handle);
    __cxa_guard_release(&setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)
                         ::nullFederate);
  }
  pFVar5 = getFederateAt(this,federateID);
  if (pFVar5 == (FederateState *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "FederateID is not valid (setFederateOperator)";
    message._M_len = 0x2d;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  ActionMessage::ActionMessage(&local_e0,cmd_core_configure);
  local_e0.messageID = 0x240;
  if ((callbacks->super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    (callbacks->super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         setFederateOperator::nullFederate.
         super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(callbacks->super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount,
               &setFederateOperator::nullFederate.
                super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  LOCK();
  paVar1 = &this->nextAirLock;
  uVar6 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
  (paVar1->super___atomic_base<unsigned_short>)._M_i =
       (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
  UNLOCK();
  uVar6 = uVar6 & 3;
  if (uVar6 == 3) {
    uVar2 = 4;
    do {
      LOCK();
      uVar3 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
      bVar7 = uVar2 == uVar3;
      if (bVar7) {
        (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = uVar2 & 3;
        uVar3 = uVar2;
      }
      UNLOCK();
    } while ((!bVar7) && (uVar2 = uVar3, 3 < uVar3));
  }
  gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
  load<std::shared_ptr<helics::FederateOperator>>
            ((AirLock<std::any,std::mutex,std::condition_variable> *)
             ((this->dataAirlocks)._M_elems + uVar6),callbacks);
  local_e0.source_id.gid = (pFVar5->global_id)._M_i.gid;
  local_e0.counter = uVar6;
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
             &(this->super_BrokerBase).actionQueue,&local_e0);
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CommonCore::setFederateOperator(LocalFederateId federateID,
                                     std::shared_ptr<FederateOperator> callbacks)
{
    static const std::shared_ptr<FederateOperator> nullFederate =
        std::make_shared<NullFederateOperator>();

    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (setFederateOperator)"));
    }

    ActionMessage fedOpUpdate(CMD_CORE_CONFIGURE);
    fedOpUpdate.messageID = UPDATE_FEDERATE_OPERATOR;
    if (!callbacks) {
        callbacks = nullFederate;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callbacks));
    fedOpUpdate.counter = index;
    fedOpUpdate.source_id = fed->global_id.load();
    actionQueue.push(fedOpUpdate);
}